

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDfsCone(Gia_Man_t *p,Gia_Obj_t *pRoot)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCo(pRoot);
  if (iVar1 != 0) {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    pGVar4 = Gia_ManConst0(p);
    pGVar4->Value = 0;
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar5 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCi(p,local_2c);
        bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_28->Value = uVar2;
      local_2c = local_2c + 1;
    }
    pGVar4 = Gia_ObjFanin0(pRoot);
    Gia_ManDupDfs_rec(p_00,p,pGVar4);
    iVar1 = Gia_ObjFanin0Copy(pRoot);
    Gia_ManAppendCo(p_00,iVar1);
    Gia_ManSetRegNum(p_00,0);
    return p_00;
  }
  __assert_fail("Gia_ObjIsCo(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x792,"Gia_Man_t *Gia_ManDupDfsCone(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupDfsCone( Gia_Man_t * p, Gia_Obj_t * pRoot )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ObjIsCo(pRoot) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManDupDfs_rec( pNew, p, Gia_ObjFanin0(pRoot) );
    Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pRoot) );
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}